

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O2

void google::CaptureTestStderr(void)

{
  CapturedStream *this;
  ostream *poVar1;
  LogMessage local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,fLS::FLAGS_test_tmpdir_abi_cxx11_,"/captured.err");
  if (_ZN6googleL18s_captured_streamsE_0 == (CapturedStream *)0x0) {
    this = (CapturedStream *)operator_new(0x28);
    CapturedStream::CapturedStream(this,2,&local_30);
    _ZN6googleL18s_captured_streamsE_0 = this;
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
             ,0x149);
  poVar1 = LogMessage::stream(&local_40);
  std::operator<<(poVar1,"Check failed: s_captured_streams[fd] == NULL ");
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

static inline void CaptureTestStderr() {
  CaptureTestOutput(STDERR_FILENO, FLAGS_test_tmpdir + "/captured.err");
}